

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

string * __thiscall
spvtools::val::(anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Instruction *inst)

{
  StorageClass operand;
  ostream *poVar1;
  AssemblyGrammar *this_00;
  char *pcVar2;
  Instruction *inst_00;
  string local_1b8;
  ostringstream local_198 [8];
  ostringstream ss;
  Instruction *inst_local;
  BuiltInsValidator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  GetIdDesc_abi_cxx11_(&local_1b8,(_anonymous_namespace_ *)inst,inst_00);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  std::operator<<(poVar1," uses storage class ");
  std::__cxx11::string::~string((string *)&local_1b8);
  this_00 = ValidationState_t::grammar(*this);
  operand = anon_unknown_0::GetStorageClass(inst);
  pcVar2 = AssemblyGrammar::lookupOperandName(this_00,SPV_OPERAND_TYPE_STORAGE_CLASS,operand);
  std::operator<<((ostream *)local_198,pcVar2);
  std::operator<<((ostream *)local_198,".");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string BuiltInsValidator::GetStorageClassDesc(
    const Instruction& inst) const {
  std::ostringstream ss;
  ss << GetIdDesc(inst) << " uses storage class ";
  ss << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                      uint32_t(GetStorageClass(inst)));
  ss << ".";
  return ss.str();
}